

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

bool __thiscall
cmQtAutoMocUic::JobEvaluateT::MocEvalSource(JobEvaluateT *this,SourceFileHandleT *source)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *filename;
  element_type *peVar3;
  void *pvVar4;
  pointer pIVar5;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  const_iterator cVar13;
  long *plVar14;
  size_type *psVar15;
  byte bVar16;
  IncludeKeyT *incKey;
  string *psVar17;
  pointer pIVar18;
  pointer pIVar19;
  char cVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string emsg;
  SourceFileHandleT header;
  string sourceBase;
  SourceFileHandleT header_1;
  string sourceDir;
  string local_1f8;
  byte local_1d1;
  string local_1d0;
  element_type *local_1b0;
  string local_1a8;
  string local_188;
  undefined4 local_164;
  element_type *local_160;
  SourceFileHandleT *local_158;
  undefined1 local_150 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  SourceFileHandleT local_110;
  SourceFileHandleT local_100;
  SourceFileHandleT local_f0;
  pointer local_e0;
  undefined1 local_d8 [16];
  SourceFileHandleT local_c8;
  SourceFileHandleT local_b8;
  SourceFileHandleT local_a8;
  SourceFileHandleT local_98;
  SourceFileHandleT local_88;
  SourceFileHandleT local_78;
  SourceFileHandleT local_68;
  string local_50;
  
  filename = (source->super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  if (filename->Moc != true) {
    return true;
  }
  peVar3 = (filename->ParseData).
           super___shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (((*(size_type *)((long)&(peVar3->Moc).Macro + 8) == 0) &&
      (*(pointer *)
        &(peVar3->Moc).Include.Underscore.
         super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
         ._M_impl == *(pointer *)((long)&(peVar3->Moc).Include + 8))) &&
     (*(pointer *)((long)&(peVar3->Moc).Include + 0x18) ==
      *(pointer *)((long)&(peVar3->Moc).Include + 0x20))) {
    return true;
  }
  local_158 = source;
  cmQtAutoGen::SubDirPrefix(&local_50,&filename->FileName);
  local_160 = filename;
  cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&local_130,&filename->FileName);
  uVar8 = local_130._8_8_;
  uVar7 = local_130._M_allocated_capacity;
  pvVar4 = ((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_;
  local_1d1 = *(byte *)((long)pvVar4 + 0x272);
  uVar12 = CONCAT71((int7)((ulong)pvVar4 >> 8),local_1d1);
  bVar16 = 1;
  local_1b0 = peVar3;
  if (local_1d1 == 1) {
    pIVar5 = *(pointer *)((long)&(peVar3->Moc).Include + 8);
    for (pIVar18 = *(pointer *)
                    &(peVar3->Moc).Include.Underscore.
                     super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
                     ._M_impl; bVar16 = 1, pIVar18 != pIVar5; pIVar18 = pIVar18 + 1) {
      if (*(size_type *)((long)&pIVar18->Base + 8) == uVar8) {
        if (uVar8 != 0) {
          uVar10 = bcmp((pIVar18->Base)._M_dataplus._M_p,(void *)uVar7,uVar8);
          uVar12 = (ulong)uVar10;
          if (uVar10 != 0) goto LAB_0019ba9d;
        }
        bVar16 = 0;
        break;
      }
LAB_0019ba9d:
    }
  }
  uVar8 = local_130._8_8_;
  uVar7 = local_130._M_allocated_capacity;
  pIVar5 = *(pointer *)((long)&(local_1b0->Moc).Include + 0x20);
  peVar3 = local_1b0;
  for (pIVar18 = *(pointer *)((long)&(local_1b0->Moc).Include + 0x18); local_1b0 = peVar3,
      pIVar18 != pIVar5; pIVar18 = pIVar18 + 1) {
    if (*(size_type *)((long)&pIVar18->Base + 8) == uVar8) {
      if (uVar8 != 0) {
        uVar10 = bcmp((pIVar18->Base)._M_dataplus._M_p,(void *)uVar7,uVar8);
        uVar12 = (ulong)uVar10;
        if (uVar10 != 0) goto LAB_0019baf4;
      }
      local_164 = 0;
      goto LAB_0019bcb8;
    }
LAB_0019baf4:
    peVar3 = local_1b0;
  }
  local_164 = (undefined4)CONCAT71((int7)(uVar12 >> 8),1);
  if (((byte)(bVar16 | local_1d1 ^ 1) == 1) && (*(size_type *)((long)&(peVar3->Moc).Macro + 8) != 0)
     ) {
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"The file contains a ","");
    cmQtAutoGen::Quoted(&local_1d0,(string *)peVar3);
    std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_188);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_130._M_allocated_capacity,
               local_130._8_8_ + local_130._M_allocated_capacity);
    std::__cxx11::string::append((char *)&local_1f8);
    cmQtAutoGen::Quoted(&local_1d0,&local_1f8);
    std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_188);
    std::__cxx11::string::_M_append((char *)&local_188,local_130._M_allocated_capacity);
    std::__cxx11::string::append((char *)&local_188);
    pvVar4 = ((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_;
    LOCK();
    *(undefined1 *)((long)pvVar4 + 0x808) = 1;
    UNLOCK();
    cmWorkerPool::Abort((cmWorkerPool *)((long)pvVar4 + 0x810));
    cmQtAutoGenerator::Logger::ErrorFile
              ((Logger *)
               ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ + 0x70),MOC,
               &local_160->FileName,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
LAB_0019cff6:
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
LAB_0019d006:
    bVar9 = false;
  }
  else {
LAB_0019bcb8:
    pIVar18 = *(pointer *)
               &(local_1b0->Moc).Include.Underscore.
                super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
                ._M_impl;
    local_e0 = *(pointer *)((long)&(local_1b0->Moc).Include + 8);
    if (pIVar18 != local_e0) {
      local_164 = CONCAT31((int3)((uint)local_164 >> 8),(byte)local_164 & local_1d1);
      psVar17 = &pIVar18->Base;
      do {
        std::operator+(&local_188,psVar17 + -1,psVar17);
        MocFindIncludedHeader((JobEvaluateT *)local_150,(string *)this,&local_50);
        uVar7 = local_150._0_8_;
        psVar1 = psVar17 + -2;
        if ((element_type *)local_150._0_8_ == (element_type *)0x0) {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"The file includes the moc file ","");
          cmQtAutoGen::Quoted(&local_1f8,psVar1);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          MocMessageTestHeaders(&local_1f8,this,&local_188);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          pvVar4 = ((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_;
          LOCK();
          *(undefined1 *)((long)pvVar4 + 0x808) = 1;
          UNLOCK();
          cmWorkerPool::Abort((cmWorkerPool *)((long)pvVar4 + 0x810));
          cmQtAutoGenerator::Logger::ErrorFile
                    ((Logger *)
                     ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ + 0x70)
                     ,MOC,&local_160->FileName,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          cVar20 = '\x01';
        }
        else if ((((char)local_164 == '\0') ||
                 (*(size_type *)((long)&(local_1b0->Moc).Macro + 8) == 0)) ||
                ((sVar6 = psVar17->_M_string_length, sVar6 != local_130._8_8_ ||
                 ((sVar6 != 0 &&
                  (iVar11 = bcmp((psVar17->_M_dataplus)._M_p,(void *)local_130._M_allocated_capacity
                                 ,sVar6), iVar11 != 0)))))) {
          pvVar4 = ((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_;
          cVar20 = '\a';
          if ((*(char *)((long)pvVar4 + 0x270) == '\x01') &&
             (cVar13 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)((long)pvVar4 + 0x300),(key_type *)uVar7),
             cVar13.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0)) {
            local_88.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (local_158->
                     super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_88.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (local_158->
                 super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            local_98.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)uVar7;
            if (local_88.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_88.
                 super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_88.
                      super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
                local_98.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)local_150._0_8_;
              }
              else {
                (local_88.
                 super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_88.
                      super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_98.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_;
            local_150._0_8_ = (element_type *)0x0;
            local_150._8_8_ = (cmWorkerPool *)0x0;
            bVar9 = MocRegisterIncluded(this,psVar1,&local_88,&local_98,true);
            if ((cmWorkerPool *)
                local_98.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (cmWorkerPool *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_98.
                         super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if (local_88.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_88.
                         super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            cVar20 = !bVar9;
          }
        }
        else {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"The file contains a ","");
          cmQtAutoGen::Quoted(&local_1f8,(string *)local_1b0);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,local_130._M_allocated_capacity,
                     local_130._8_8_ + local_130._M_allocated_capacity);
          std::__cxx11::string::append((char *)&local_1a8);
          cmQtAutoGen::Quoted(&local_1f8,&local_1a8);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          cmQtAutoGen::Quoted(&local_1f8,psVar1);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          cmQtAutoGen::Quoted(&local_1f8,&local_160->FileName);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,local_130._M_allocated_capacity,
                     local_130._8_8_ + local_130._M_allocated_capacity);
          std::__cxx11::string::append((char *)&local_1a8);
          cmQtAutoGen::Quoted(&local_1f8,&local_1a8);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          std::__cxx11::string::append((char *)&local_1d0);
          cmQtAutoGenerator::Logger::WarningFile
                    ((Logger *)
                     ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ + 0x70)
                     ,MOC,&local_160->FileName,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          local_78.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_78.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_158->
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_78.
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (local_78.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_78.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_78.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
              local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (local_158->
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_f0.
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
              goto LAB_0019c283;
            }
            else {
              (local_78.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_78.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   local_78.
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_f0.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_f0.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
LAB_0019c283:
          bVar9 = MocRegisterIncluded(this,psVar1,&local_78,&local_f0,false);
          if (local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f0.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          cVar20 = '\x01';
          if (bVar9) {
            cVar20 = '\a';
          }
        }
        if ((cmWorkerPool *)local_150._8_8_ != (cmWorkerPool *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((cVar20 != '\a') && (cVar20 != '\0')) goto LAB_0019d006;
        pIVar18 = (pointer)(psVar17 + 1);
        psVar17 = psVar17 + 3;
      } while (pIVar18 != local_e0);
    }
    pIVar18 = *(pointer *)((long)&(local_1b0->Moc).Include + 0x18);
    pIVar5 = *(pointer *)((long)&(local_1b0->Moc).Include + 0x20);
    if (local_1d1 == 0) {
      if (pIVar18 != pIVar5) {
        do {
          pIVar19 = pIVar18 + 1;
          sVar6 = (pIVar18->Base)._M_string_length;
          if ((sVar6 != local_130._8_8_) ||
             ((sVar6 != 0 &&
              (iVar11 = bcmp((pIVar18->Base)._M_dataplus._M_p,
                             (void *)local_130._M_allocated_capacity,sVar6), iVar11 != 0)))) {
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_188,"The file includes the moc file ","");
            cmQtAutoGen::Quoted(&local_1d0,&pIVar18->Key);
            std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&local_188);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f8,local_130._M_allocated_capacity,
                       local_130._8_8_ + local_130._M_allocated_capacity);
            std::__cxx11::string::append((char *)&local_1f8);
            cmQtAutoGen::Quoted(&local_1d0,&local_1f8);
            std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&local_188);
            pvVar4 = ((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_;
            LOCK();
            *(undefined1 *)((long)pvVar4 + 0x808) = 1;
            UNLOCK();
            cmWorkerPool::Abort((cmWorkerPool *)((long)pvVar4 + 0x810));
            cmQtAutoGenerator::Logger::ErrorFile
                      ((Logger *)
                       ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                       0x70),MOC,&local_160->FileName,&local_188);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p == &local_188.field_2) goto LAB_0019d006;
            goto LAB_0019cff6;
          }
          if (*(size_type *)((long)&(local_1b0->Moc).Macro + 8) == 0) {
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_188,"The file includes the moc file ","");
            cmQtAutoGen::Quoted(&local_1d0,&pIVar18->Key);
            std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&local_188);
            MocSettingsT::MacrosString_abi_cxx11_
                      (&local_1d0,
                       (MocSettingsT *)
                       ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                       0x270));
            std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&local_188);
            cmQtAutoGenerator::Logger::WarningFile
                      ((Logger *)
                       ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                       0x70),MOC,&local_160->FileName,&local_188);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_c8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_c8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_158->
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          local_110.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_c8.
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (local_c8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_110.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_c8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c8.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
              local_110.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (local_158->
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_110.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_110.
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
              goto LAB_0019ce3a;
            }
            else {
              (local_c8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c8.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              local_110.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   local_c8.
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_110.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_110.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_110.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_110.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
LAB_0019ce3a:
          bVar9 = MocRegisterIncluded(this,&pIVar18->Key,&local_c8,&local_110,false);
          if (local_110.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_110.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          pIVar18 = pIVar19;
        } while (bVar9 && pIVar19 != pIVar5);
        goto LAB_0019d009;
      }
    }
    else if (pIVar18 != pIVar5) {
      psVar17 = &pIVar18->Base;
      local_e0 = pIVar5;
      do {
        psVar1 = psVar17 + -2;
        sVar6 = psVar17->_M_string_length;
        if (sVar6 == local_130._8_8_) {
          if ((sVar6 != 0) &&
             (iVar11 = bcmp((psVar17->_M_dataplus)._M_p,(void *)local_130._M_allocated_capacity,
                            sVar6), iVar11 != 0)) {
            bVar9 = false;
            goto LAB_0019c3aa;
          }
          if (*(size_type *)((long)&(local_1b0->Moc).Macro + 8) == 0) {
            bVar9 = true;
            goto LAB_0019c3aa;
          }
          local_a8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_a8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_158->
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          local_100.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_a8.
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (local_a8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_100.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_a8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_a8.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
              local_100.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (local_158->
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_100.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_100.
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
              goto LAB_0019c6b1;
            }
            else {
              (local_a8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_a8.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              local_100.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   local_a8.
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_100.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_100.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_100.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_100.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
LAB_0019c6b1:
          bVar9 = MocRegisterIncluded(this,psVar1,&local_a8,&local_100,false);
          if (local_100.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_100.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_a8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (!bVar9) goto LAB_0019d006;
        }
        else {
          bVar9 = false;
LAB_0019c3aa:
          std::operator+(&local_188,psVar17 + -1,psVar17);
          MocFindIncludedHeader((JobEvaluateT *)local_d8,(string *)this,&local_50);
          uVar7 = local_d8._0_8_;
          if ((element_type *)local_d8._0_8_ == (element_type *)0x0) {
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d0,"The file includes the moc file ","");
            cmQtAutoGen::Quoted(&local_1f8,psVar1);
            std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&local_1d0);
            MocMessageTestHeaders(&local_1f8,this,&local_188);
            std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            pvVar4 = ((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_;
            LOCK();
            *(undefined1 *)((long)pvVar4 + 0x808) = 1;
            UNLOCK();
            cmWorkerPool::Abort((cmWorkerPool *)((long)pvVar4 + 0x810));
            cmQtAutoGenerator::Logger::ErrorFile
                      ((Logger *)
                       ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                       0x70),MOC,&local_160->FileName,&local_1d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            cVar20 = '\x01';
          }
          else {
            pvVar4 = ((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_;
            cVar20 = '\t';
            if ((*(char *)((long)pvVar4 + 0x270) == '\x01') &&
               (cVar13 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)((long)pvVar4 + 0x300),(key_type *)local_d8._0_8_),
               cVar13.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur == (__node_type *)0x0)) {
              if ((bVar9) && (*(size_type *)((long)&(local_1b0->Moc).Macro + 8) == 0)) {
                local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d0,"The file includes the moc file ","");
                cmQtAutoGen::Quoted(&local_1f8,psVar1);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                MocSettingsT::MacrosString_abi_cxx11_
                          (&local_1f8,
                           (MocSettingsT *)
                           ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                           0x270));
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                cmQtAutoGen::Quoted(&local_1f8,(string *)uVar7);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_150,"moc_",psVar17);
                plVar14 = (long *)std::__cxx11::string::append((char *)local_150);
                psVar15 = (size_type *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar15) {
                  local_1a8.field_2._M_allocated_capacity = *psVar15;
                  local_1a8.field_2._8_8_ = plVar14[3];
                  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                }
                else {
                  local_1a8.field_2._M_allocated_capacity = *psVar15;
                  local_1a8._M_dataplus._M_p = (pointer)*plVar14;
                }
                local_1a8._M_string_length = plVar14[1];
                *plVar14 = (long)psVar15;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                cmQtAutoGen::Quoted(&local_1f8,&local_1a8);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
                if ((element_type *)local_150._0_8_ != (element_type *)(local_150 + 0x10)) {
                  operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                std::__cxx11::string::append((char *)&local_1d0);
                cmQtAutoGenerator::Logger::WarningFile
                          ((Logger *)
                           ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                           0x70),MOC,&local_160->FileName,&local_1d0);
              }
              else {
                local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d0,"The file includes the moc file ","");
                paVar2 = &local_1a8.field_2;
                cmQtAutoGen::Quoted(&local_1f8,psVar1);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_150,"moc_",psVar17);
                plVar14 = (long *)std::__cxx11::string::append((char *)local_150);
                psVar15 = (size_type *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar15) {
                  local_1a8.field_2._M_allocated_capacity = *psVar15;
                  local_1a8.field_2._8_8_ = plVar14[3];
                  local_1a8._M_dataplus._M_p = (pointer)paVar2;
                }
                else {
                  local_1a8.field_2._M_allocated_capacity = *psVar15;
                  local_1a8._M_dataplus._M_p = (pointer)*plVar14;
                }
                local_1a8._M_string_length = plVar14[1];
                *plVar14 = (long)psVar15;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                cmQtAutoGen::Quoted(&local_1f8,&local_1a8);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != paVar2) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
                if ((element_type *)local_150._0_8_ != (element_type *)(local_150 + 0x10)) {
                  operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                cmQtAutoGen::Quoted(&local_1f8,(string *)local_d8._0_8_);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_150,"moc_",psVar17);
                plVar14 = (long *)std::__cxx11::string::append((char *)local_150);
                psVar15 = (size_type *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar15) {
                  local_1a8.field_2._M_allocated_capacity = *psVar15;
                  local_1a8.field_2._8_8_ = plVar14[3];
                  local_1a8._M_dataplus._M_p = (pointer)paVar2;
                }
                else {
                  local_1a8.field_2._M_allocated_capacity = *psVar15;
                  local_1a8._M_dataplus._M_p = (pointer)*plVar14;
                }
                local_1a8._M_string_length = plVar14[1];
                *plVar14 = (long)psVar15;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                cmQtAutoGen::Quoted(&local_1f8,&local_1a8);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != paVar2) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
                if ((element_type *)local_150._0_8_ != (element_type *)(local_150 + 0x10)) {
                  operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                std::__cxx11::string::append((char *)&local_1d0);
                cmQtAutoGenerator::Logger::WarningFile
                          ((Logger *)
                           ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                           0x70),MOC,&local_160->FileName,&local_1d0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              local_b8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (local_158->
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_b8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_b8.
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_b8.
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_b8.
                        super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_b8.
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_b8.
                        super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_68.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)local_d8._0_8_;
              local_68.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
              local_d8._0_8_ = (element_type *)0x0;
              local_d8._8_8_ = (cmWorkerPool *)0x0;
              bVar9 = MocRegisterIncluded(this,psVar1,&local_b8,&local_68,true);
              if ((cmWorkerPool *)
                  local_68.
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (cmWorkerPool *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_68.
                           super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              if (local_b8.
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_b8.
                           super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              cVar20 = !bVar9;
            }
          }
          if ((cmWorkerPool *)local_d8._8_8_ != (cmWorkerPool *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((cVar20 != '\t') && (cVar20 != '\0')) goto LAB_0019d006;
        }
        pIVar18 = (pointer)(psVar17 + 1);
        psVar17 = psVar17 + 3;
      } while (pIVar18 != local_e0);
    }
    bVar9 = true;
  }
LAB_0019d009:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_allocated_capacity != &local_120) {
    operator_delete((void *)local_130._M_allocated_capacity,local_120._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar9;
}

Assistant:

bool cmQtAutoMocUic::JobEvaluateT::MocEvalSource(
  SourceFileHandleT const& source)
{
  SourceFileT const& sourceFile = *source;
  auto const& parseData = sourceFile.ParseData->Moc;
  if (!sourceFile.Moc ||
      (parseData.Macro.empty() && parseData.Include.Underscore.empty() &&
       parseData.Include.Dot.empty())) {
    return true;
  }

  std::string const sourceDir = SubDirPrefix(sourceFile.FileName);
  std::string const sourceBase =
    cmSystemTools::GetFilenameWithoutLastExtension(sourceFile.FileName);

  // For relaxed mode check if the own "moc_" or ".moc" file is included
  bool const relaxedMode = MocConst().RelaxedMode;
  bool sourceIncludesMocUnderscore = false;
  bool sourceIncludesDotMoc = false;
  // Check if the sources own "moc_" or ".moc" file is included
  if (relaxedMode) {
    for (IncludeKeyT const& incKey : parseData.Include.Underscore) {
      if (incKey.Base == sourceBase) {
        sourceIncludesMocUnderscore = true;
        break;
      }
    }
  }
  for (IncludeKeyT const& incKey : parseData.Include.Dot) {
    if (incKey.Base == sourceBase) {
      sourceIncludesDotMoc = true;
      break;
    }
  }

  // Check if this source needs to be moc processed but doesn't.
  if (!sourceIncludesDotMoc && !parseData.Macro.empty() &&
      !(relaxedMode && sourceIncludesMocUnderscore)) {
    {
      std::string emsg = "The file contains a ";
      emsg += Quoted(parseData.Macro);
      emsg += " macro, but does not include ";
      emsg += Quoted(sourceBase + ".moc");
      emsg += "!\nConsider to\n  - add #include \"";
      emsg += sourceBase;
      emsg += ".moc\"\n  - enable SKIP_AUTOMOC for this file";
      LogFileError(GenT::MOC, sourceFile.FileName, emsg);
    }
    return false;
  }

  // Evaluate "moc_" includes
  for (IncludeKeyT const& incKey : parseData.Include.Underscore) {
    std::string const headerBase = incKey.Dir + incKey.Base;
    SourceFileHandleT header = MocFindIncludedHeader(sourceDir, headerBase);
    if (!header) {
      {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nbut the header could not be found "
               "in the following locations\n";
        msg += MocMessageTestHeaders(headerBase);
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
      }
      return false;
    }
    // The include might be handled differently in relaxed mode
    if (relaxedMode && !sourceIncludesDotMoc && !parseData.Macro.empty() &&
        (incKey.Base == sourceBase)) {
      // The <BASE>.cpp file includes a Qt macro but does not include the
      // <BASE>.moc file. In this case, the moc_<BASE>.cpp should probably
      // be generated from <BASE>.cpp instead of <BASE>.h, because otherwise
      // it won't build. But warn, since this is not how it is supposed to be
      // used. This is for KDE4 compatibility.
      {
        // Issue a warning
        std::string msg = "The file contains a ";
        msg += Quoted(parseData.Macro);
        msg += " macro, but does not include ";
        msg += Quoted(sourceBase + ".moc");
        msg += ".\nInstead it includes ";
        msg += Quoted(incKey.Key);
        msg += ".\nRunning moc on the source\n  ";
        msg += Quoted(sourceFile.FileName);
        msg += "!\nBetter include ";
        msg += Quoted(sourceBase + ".moc");
        msg += " for compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
        return false;
      }
      continue;
    }

    // Check if header is skipped
    if (MocConst().skipped(header->FileName)) {
      continue;
    }
    // Create mapping
    if (!MocRegisterIncluded(incKey.Key, source, std::move(header), true)) {
      return false;
    }
  }

  // Evaluate ".moc" includes
  if (relaxedMode) {
    // Relaxed mode
    for (IncludeKeyT const& incKey : parseData.Include.Dot) {
      // Check if this is the sources own .moc file
      bool const ownMoc = (incKey.Base == sourceBase);
      if (ownMoc && !parseData.Macro.empty()) {
        // Create mapping for the regular use case
        if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
          return false;
        }
        continue;
      }
      // Try to find a header instead but issue a warning.
      // This is for KDE4 compatibility.
      std::string const headerBase = incKey.Dir + incKey.Base;
      SourceFileHandleT header = MocFindIncludedHeader(sourceDir, headerBase);
      if (!header) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nwhich seems to be the moc file from a different source "
               "file.\nCMAKE_AUTOMOC_RELAXED_MODE: Also a matching header"
               "could not be found in the following locations\n";
        msg += MocMessageTestHeaders(headerBase);
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
        return false;
      }
      // Check if header is skipped
      if (MocConst().skipped(header->FileName)) {
        continue;
      }
      // Issue a warning
      if (ownMoc && parseData.Macro.empty()) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ", but does not contain a\n";
        msg += MocConst().MacrosString();
        msg += " macro.\nRunning moc on the header\n  ";
        msg += Quoted(header->FileName);
        msg += "!\nBetter include ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += " for a compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      } else {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += " instead of ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += ".\nRunning moc on the header\n  ";
        msg += Quoted(header->FileName);
        msg += "!\nBetter include ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += " for compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, std::move(header), true)) {
        return false;
      }
    }
  } else {
    // Strict mode
    for (IncludeKeyT const& incKey : parseData.Include.Dot) {
      // Check if this is the sources own .moc file
      bool const ownMoc = (incKey.Base == sourceBase);
      if (!ownMoc) {
        // Don't allow <BASE>.moc include other than own in regular mode
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nwhich seems to be the moc file from a different "
               "source file.\nThis is not supported.  Include ";
        msg += Quoted(sourceBase + ".moc");
        msg += " to run moc on this source file.";
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
        return false;
      }
      // Accept but issue a warning if moc isn't required
      if (parseData.Macro.empty()) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ", but does not contain a ";
        msg += MocConst().MacrosString();
        msg += " macro.";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
        return false;
      }
    }
  }

  return true;
}